

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O3

void __thiscall aggreports::LoadEnsembleMapping(aggreports *this)

{
  iterator __position;
  FILE *__stream;
  size_t sVar1;
  vector<int,std::allocator<int>> *this_00;
  int *piVar2;
  Ensemble e;
  vector<int,_std::allocator<int>_> sidxtoensemble;
  allocator_type local_45;
  int local_44;
  int local_40;
  value_type_conflict1 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  __stream = fopen("input/ensemble.bin","rb");
  if (__stream != (FILE *)0x0) {
    local_3c = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_38,(long)this->samplesize_ + 1,&local_3c,&local_45);
    sVar1 = fread(&local_44,8,1,__stream);
    piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (sVar1 != 0) {
      do {
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_44] = local_40;
        this_00 = (vector<int,std::allocator<int>> *)
                  std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->ensembletosidx_,&local_40);
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,&local_44);
        }
        else {
          *__position._M_current = local_44;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
        sVar1 = fread(&local_44,8,1,__stream);
        piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (sVar1 != 0);
    }
    do {
      piVar2 = piVar2 + 1;
      if (piVar2 == local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_001066f3;
    } while (*piVar2 != 0);
    LoadEnsembleMapping();
LAB_001066f3:
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void aggreports::LoadEnsembleMapping() {

  FILE *fin = fopen(ENSEMBLE_FILE, "rb");
  if (fin == NULL) return;

  Ensemble e;
  std::vector<int> sidxtoensemble(samplesize_+1, 0);
  size_t i = fread(&e, sizeof(Ensemble), 1, fin);
  while (i != 0) {
    sidxtoensemble[e.sidx] = e.ensemble_id;
    ensembletosidx_[e.ensemble_id].push_back(e.sidx);
    i = fread(&e, sizeof(Ensemble), 1, fin);
  }

  // Check all sidx have ensemble IDs
  for (std::vector<int>::const_iterator it = std::next(sidxtoensemble.begin());
       it != sidxtoensemble.end(); ++it) {
    if (*it == 0) {
      fprintf(stderr, "FATAL: All sidx must have associated ensemble IDs\n");
      exit(EXIT_FAILURE);
    }
  }

}